

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uspoof.cpp
# Opt level: O0

int32_t uspoof_check2UnicodeString_63
                  (USpoofChecker *sc,UnicodeString *id,USpoofCheckResult *checkResult,
                  UErrorCode *status)

{
  SpoofImpl *This_00;
  undefined1 local_b0 [8];
  CheckResult stackCheckResult;
  CheckResult *ThisCheckResult;
  SpoofImpl *This;
  UErrorCode *status_local;
  USpoofCheckResult *checkResult_local;
  UnicodeString *id_local;
  USpoofChecker *sc_local;
  
  This_00 = icu_63::SpoofImpl::validateThis(sc,status);
  if (This_00 == (SpoofImpl *)0x0) {
    sc_local._4_4_ = 0;
  }
  else if (checkResult == (USpoofCheckResult *)0x0) {
    icu_63::CheckResult::CheckResult((CheckResult *)local_b0);
    sc_local._4_4_ = checkImpl_63(This_00,id,(CheckResult *)local_b0,status);
    icu_63::CheckResult::~CheckResult((CheckResult *)local_b0);
  }
  else {
    stackCheckResult._104_8_ = icu_63::CheckResult::validateThis(checkResult,status);
    if ((CheckResult *)stackCheckResult._104_8_ == (CheckResult *)0x0) {
      sc_local._4_4_ = 0;
    }
    else {
      sc_local._4_4_ = checkImpl_63(This_00,id,(CheckResult *)stackCheckResult._104_8_,status);
    }
  }
  return sc_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uspoof_check2UnicodeString(const USpoofChecker *sc,
                          const icu::UnicodeString &id,
                          USpoofCheckResult* checkResult,
                          UErrorCode *status) {
    const SpoofImpl *This = SpoofImpl::validateThis(sc, *status);
    if (This == NULL) {
        return FALSE;
    }

    if (checkResult != NULL) {
        CheckResult* ThisCheckResult = CheckResult::validateThis(checkResult, *status);
        if (ThisCheckResult == NULL) {
            return FALSE;
        }
        return checkImpl(This, id, ThisCheckResult, status);
    } else {
        // Stack-allocate the checkResult since this method doesn't return it
        CheckResult stackCheckResult;
        return checkImpl(This, id, &stackCheckResult, status);
    }
}